

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Iterator<float,_true,_std::allocator<unsigned_long>_>::Iterator
          (Iterator<float,_true,_std::allocator<unsigned_long>_> *this,
          View<float,_true,_std::allocator<unsigned_long>_> *view,size_t index)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  View<float,_true,_std::allocator<unsigned_long>_> *this_01;
  bool bVar1;
  size_t sVar2;
  reference pfVar3;
  size_t sVar4;
  size_t sVar5;
  size_t j;
  ulong uVar6;
  size_t j_1;
  allocator_type local_29;
  
  this->view_ = view;
  this->pointer_ = (pointer)0x0;
  this->index_ = index;
  this_00 = &this->coordinates_;
  sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::dimension(view);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_00,sVar2,&local_29);
  if ((view->geometry_).size_ == 0) {
    marray_detail::Assert<bool>(index == 0);
  }
  else {
    bVar1 = View<float,_true,_std::allocator<unsigned_long>_>::isSimple(view);
    uVar6 = (view->geometry_).size_;
    if (bVar1) {
      marray_detail::Assert<bool>(index <= uVar6);
      pfVar3 = View<float,true,std::allocator<unsigned_long>>::operator()
                         ((View<float,true,std::allocator<unsigned_long>> *)view,0);
      pfVar3 = pfVar3 + index;
    }
    else if (index < uVar6) {
      View<float,true,std::allocator<unsigned_long>>::
      indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<float,true,std::allocator<unsigned_long>> *)view,index,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start);
      pfVar3 = View<float,_true,_std::allocator<unsigned_long>_>::operator()(view,index);
    }
    else {
      this_01 = this->view_;
      View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_01);
      if ((this_01->geometry_).coordinateOrder_ == LastMajorOrder) {
        sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::shape(view,0);
        *(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start = sVar2;
        uVar6 = 1;
        while( true ) {
          sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::dimension(view);
          if (sVar2 <= uVar6) break;
          sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::shape(view,uVar6);
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = sVar2 - 1;
          uVar6 = uVar6 + 1;
        }
      }
      else {
        sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
        sVar4 = View<float,_true,_std::allocator<unsigned_long>_>::shape(view,sVar2 - 1);
        (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar2 - 1] = sVar4;
        for (sVar4 = 0; sVar2 - 1 != sVar4; sVar4 = sVar4 + 1) {
          sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::shape(view,sVar4);
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar4] = sVar5 - 1;
        }
      }
      pfVar3 = View<float,_true,_std::allocator<unsigned_long>_>::operator()
                         (view,(view->geometry_).size_ - 1);
      pfVar3 = pfVar3 + 1;
    }
    this->pointer_ = pfVar3;
  }
  testInvariant(this);
  return;
}

Assistant:

inline Iterator<T, isConst, A>::Iterator
(
    const View<T, true, A>& view,
    const std::size_t index
)
:   view_(&view),
    pointer_(0),
    index_(index),
    coordinates_(std::vector<std::size_t>(view.dimension()))
    // Note for developers: If isConst==false, the construction view_(&view)
    // fails due to incompatible types. This is intended because it should 
    // not be possible to construct a mutable iterator on constant data.
{
    if(view.size() == 0) { // un-initialized view
        marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
    }
    else {
        if(view.isSimple()) {
            marray_detail::Assert(MARRAY_NO_ARG_TEST || index <= view.size());
            pointer_ = &view(0) + index;
        }
        else {
            if(index >= view.size()) { // end iterator
                if(view_->coordinateOrder() == LastMajorOrder) {
                    coordinates_[0] = view.shape(0);
                    for(std::size_t j=1; j<view.dimension(); ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                else { // FirstMajorOrder
                    std::size_t d = view_->dimension() - 1;
                    coordinates_[d] = view.shape(d);
                    for(std::size_t j=0; j<d; ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                pointer_ = &view(view.size()-1) + 1;
            }
            else {
                view.indexToCoordinates(index, coordinates_.begin());
                pointer_ = &view(index);
            }
        }
    }
    testInvariant();
}